

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O2

Ref<embree::SceneGraph::PerspectiveCameraNode> __thiscall
embree::TutorialScene::getCamera(TutorialScene *this,string *name)

{
  pointer pcVar1;
  pointer pRVar2;
  __type _Var3;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  size_t i;
  ulong uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  uVar4 = 0;
  while( true ) {
    pcVar1 = (name->_M_dataplus)._M_p;
    if ((ulong)((long)(name->_M_string_length - (long)pcVar1) >> 3) <= uVar4) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&bStack_68,"camera \"",in_RDX);
      std::operator+(&local_48,&bStack_68,"\" not found");
      std::runtime_error::runtime_error(this_00,(string *)&local_48);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (*(long *)(pcVar1 + uVar4 * 8) + 0x30),in_RDX);
    if (_Var3) break;
    uVar4 = uVar4 + 1;
  }
  pRVar2 = *(pointer *)((name->_M_dataplus)._M_p + uVar4 * 8);
  (this->cameras).
  super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pRVar2;
  if (pRVar2 != (pointer)0x0) {
    (*(code *)(pRVar2->ptr->super_Node).fileName._M_dataplus._M_p)();
  }
  return (Ref<embree::SceneGraph::PerspectiveCameraNode>)(PerspectiveCameraNode *)this;
}

Assistant:

Ref<SceneGraph::PerspectiveCameraNode> TutorialScene::getCamera(const std::string& name)
  {
    for (size_t i=0; i<cameras.size(); i++)
      if (cameras[i]->name == name) return cameras[i];
    
    THROW_RUNTIME_ERROR("camera \"" + name +"\" not found");
  }